

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_dec_ref_base_pic_marking
              (bitstream *str,h264_nal_svc_header *svc,h264_dec_ref_base_pic_marking *ref)

{
  uint32_t *val;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int i;
  h264_mmco_entry mmco;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 uStack_30;
  undefined8 local_2c;
  undefined4 local_24;
  int local_4;
  
  iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  if (iVar1 == 0) {
    if (((in_RSI[6] != 0) || (*in_RDX != 0)) && (*in_RSI == 0)) {
      iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      if (in_RDX[1] != 0) {
        iVar1 = 0;
        do {
          if (*in_RDI == 0) {
            puVar3 = (undefined8 *)(*(long *)(in_RDX + 2) + (long)iVar1 * 0x14);
            in_stack_ffffffffffffffcc = (uint)*puVar3;
            uStack_30 = (undefined4)((ulong)*puVar3 >> 0x20);
            local_2c = puVar3[1];
            local_24 = *(undefined4 *)(puVar3 + 2);
          }
          val = (uint32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffcc;
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),val);
          if (iVar2 != 0) {
            return 1;
          }
          in_stack_ffffffffffffffcc = in_stack_ffffffffffffffc4;
          if (in_stack_ffffffffffffffc4 != 0) {
            if (in_stack_ffffffffffffffc4 == 1) {
              iVar2 = vs_ue((bitstream *)CONCAT44(1,iVar1),
                            (uint32_t *)CONCAT44(1,in_stack_ffffffffffffffc0));
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              if (in_stack_ffffffffffffffc4 != 2) {
                fprintf(_stderr,"Unknown MMCO %d\n",(ulong)in_stack_ffffffffffffffc4);
                return 1;
              }
              iVar2 = vs_ue((bitstream *)CONCAT44(2,iVar1),
                            (uint32_t *)CONCAT44(2,in_stack_ffffffffffffffc0));
              if (iVar2 != 0) {
                return 1;
              }
            }
          }
          if (*in_RDI == 1) {
            if (in_RDX[5] <= in_RDX[4]) {
              if (in_RDX[5] == 0) {
                in_RDX[5] = 0x10;
              }
              else {
                in_RDX[5] = in_RDX[5] << 1;
              }
              pvVar4 = realloc(*(void **)(in_RDX + 2),(long)in_RDX[5] * 0x14);
              *(void **)(in_RDX + 2) = pvVar4;
            }
            iVar2 = in_RDX[4];
            in_RDX[4] = iVar2 + 1;
            puVar3 = (undefined8 *)(*(long *)(in_RDX + 2) + (long)iVar2 * 0x14);
            *puVar3 = CONCAT44(uStack_30,in_stack_ffffffffffffffcc);
            puVar3[1] = local_2c;
            *(undefined4 *)(puVar3 + 2) = local_24;
          }
          iVar1 = iVar1 + 1;
        } while (in_stack_ffffffffffffffcc != 0);
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h264_dec_ref_base_pic_marking(struct bitstream *str, struct h264_nal_svc_header *svc, struct h264_dec_ref_base_pic_marking *ref) {
	if (vs_u(str, &ref->store_ref_base_pic_flag, 1)) return 1;
	if ((svc->use_ref_base_pic_flag || ref->store_ref_base_pic_flag) && !svc->idr_flag) {
		if (vs_u(str, &ref->adaptive_ref_base_pic_marking_mode_flag, 1)) return 1;
		if (ref->adaptive_ref_base_pic_marking_mode_flag) {
			struct h264_mmco_entry mmco;
			int i = 0;
			do {
				if (str->dir == VS_ENCODE)
					mmco = ref->mmcos[i];
				if (vs_ue(str, &mmco.memory_management_control_operation)) return 1;
				switch (mmco.memory_management_control_operation) {
					case H264_MMCO_END:
						break;
					case H264_MMCO_FORGET_SHORT:
						if (vs_ue(str, &mmco.difference_of_pic_nums_minus1)) return 1;
						break;
					case H264_MMCO_FORGET_LONG:
						if (vs_ue(str, &mmco.long_term_pic_num)) return 1;
						break;
					default:
						fprintf (stderr, "Unknown MMCO %d\n", mmco.memory_management_control_operation);
						return 1;
				}
				if (str->dir == VS_DECODE) 
					ADDARRAY(ref->mmcos, mmco);
				i++;
			} while (mmco.memory_management_control_operation != H264_MMCO_END);
		}
	}
	return 0;
}